

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_LABEL(CodeGenGenericContext *ctx,uint labelID,int invalidate)

{
  int invalidate_local;
  uint labelID_local;
  CodeGenGenericContext *ctx_local;
  
  if (invalidate != 0) {
    CodeGenGenericContext::InvalidateState(ctx);
  }
  ctx->x86Op->name = o_label;
  (ctx->x86Op->field_4).labelID = labelID;
  (ctx->x86Op->argA).type = argNone;
  (ctx->x86Op->argA).field_1.num = invalidate;
  (ctx->x86Op->argB).type = argNone;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_LABEL(CodeGenGenericContext &ctx, unsigned labelID, int invalidate)
{
	if(invalidate)
		ctx.InvalidateState();

	ctx.x86Op->name = o_label;
	ctx.x86Op->labelID = labelID;
	ctx.x86Op->argA.type = x86Argument::argNone;
	ctx.x86Op->argA.num = invalidate;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}